

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::SourceLocation::SourceLocation(SourceLocation *this)

{
  SourceLocation *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__SourceLocation_009c2290;
  this->iid_ = 0;
  ::std::__cxx11::string::string((string *)&this->file_name_);
  ::std::__cxx11::string::string((string *)&this->function_name_);
  this->line_number_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<5UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

SourceLocation::SourceLocation() = default;